

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowBase.cpp
# Opt level: O0

int __thiscall sf::WindowBase::close(WindowBase *this,int __fd)

{
  WindowImpl *pWVar1;
  WindowBase *pWVar2;
  WindowBase *extraout_RAX;
  undefined4 in_register_00000034;
  
  pWVar1 = this->m_impl;
  if (pWVar1 != (WindowImpl *)0x0) {
    (*pWVar1->_vptr_WindowImpl[1])(pWVar1,CONCAT44(in_register_00000034,__fd));
  }
  this->m_impl = (WindowImpl *)0x0;
  pWVar2 = getFullscreenWindow(this);
  if (this == pWVar2) {
    setFullscreenWindow(this,(WindowBase *)0x0);
    this = extraout_RAX;
  }
  return (int)this;
}

Assistant:

void WindowBase::close()
{
    // Delete the window implementation
    delete m_impl;
    m_impl = NULL;

    // Update the fullscreen window
    if (this == getFullscreenWindow())
        setFullscreenWindow(NULL);
}